

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O0

void __thiscall
Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_>::SetComputedNameVar
          (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *this,
          Var computedNameVar)

{
  code *pcVar1;
  bool bVar2;
  FunctionInfo *this_00;
  undefined4 *puVar3;
  JavascriptString *pJStack_20;
  bool result;
  JavascriptString *functionName;
  Var computedNameVar_local;
  FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *this_local;
  
  functionName = (JavascriptString *)computedNameVar;
  computedNameVar_local = this;
  Memory::WriteBarrierPtr<void>::operator=(&this->computedNameVar,computedNameVar);
  this_00 = JavascriptFunction::GetFunctionInfo((JavascriptFunction *)this);
  bVar2 = FunctionInfo::IsClassConstructor(this_00);
  if (bVar2) {
    pJStack_20 = (JavascriptString *)0x0;
    bVar2 = JavascriptFunction::GetFunctionName((JavascriptFunction *)this,&stack0xffffffffffffffe0)
    ;
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                  ,0x3b6,"(result)","result");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    DynamicObject::SetSlot((DynamicObject *)this,-1,false,2,pJStack_20);
  }
  return;
}

Assistant:

void FunctionWithComputedName<FunctionWithHomeObj<ScriptFunction>>::SetComputedNameVar(Var computedNameVar)
    {
        this->computedNameVar = computedNameVar; 
        if (GetFunctionInfo()->IsClassConstructor())
        {
            // For class with computed name, we wait until now to set the name property.
            JavascriptString * functionName = nullptr;
            bool result = GetFunctionName(&functionName);
            Assert(result);
            SetSlot(SetSlotArguments(Constants::NoProperty, 2, functionName));
        }
    }